

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_name(char *name)

{
  int iVar1;
  mbedtls_ecp_curve_info *local_20;
  mbedtls_ecp_curve_info *curve_info;
  char *name_local;
  
  if (name != (char *)0x0) {
    for (local_20 = mbedtls_ecp_curve_list(); local_20->grp_id != MBEDTLS_ECP_DP_NONE;
        local_20 = local_20 + 1) {
      iVar1 = strcmp(local_20->name,name);
      if (iVar1 == 0) {
        return local_20;
      }
    }
  }
  return (mbedtls_ecp_curve_info *)0x0;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_name(const char *name)
{
    const mbedtls_ecp_curve_info *curve_info;

    if (name == NULL) {
        return NULL;
    }

    for (curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++) {
        if (strcmp(curve_info->name, name) == 0) {
            return curve_info;
        }
    }

    return NULL;
}